

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O3

void __thiscall jpge::jpeg_encoder::process_mcu_row(jpeg_encoder *this)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  
  if (this->m_num_components == '\x01') {
    if (0 < this->m_mcus_per_row) {
      iVar3 = 0;
      do {
        load_block_8_8_grey(this,iVar3);
        code_block(this,0);
        iVar3 = iVar3 + 1;
      } while (iVar3 < this->m_mcus_per_row);
    }
  }
  else {
    bVar2 = this->m_comp_v_samp[0] ^ 1;
    if (this->m_comp_h_samp[0] == 1 && bVar2 == 0) {
      if (0 < this->m_mcus_per_row) {
        iVar3 = 0;
        do {
          load_block_8_8(this,iVar3,0,0);
          code_block(this,0);
          load_block_8_8(this,iVar3,0,1);
          code_block(this,1);
          load_block_8_8(this,iVar3,0,2);
          code_block(this,2);
          iVar3 = iVar3 + 1;
        } while (iVar3 < this->m_mcus_per_row);
      }
    }
    else {
      bVar1 = this->m_comp_h_samp[0] ^ 2;
      if (bVar2 == 0 && bVar1 == 0) {
        if (0 < this->m_mcus_per_row) {
          iVar3 = 0;
          iVar4 = 1;
          do {
            load_block_8_8(this,iVar4 + -1,0,0);
            code_block(this,0);
            load_block_8_8(this,iVar4,0,0);
            code_block(this,0);
            load_block_16_8_8(this,iVar3,1);
            code_block(this,1);
            load_block_16_8_8(this,iVar3,2);
            code_block(this,2);
            iVar3 = iVar3 + 1;
            iVar4 = iVar4 + 2;
          } while (iVar3 < this->m_mcus_per_row);
        }
      }
      else if ((bVar1 == 0 && this->m_comp_v_samp[0] == 2) && (0 < this->m_mcus_per_row)) {
        iVar3 = 0;
        iVar4 = 1;
        do {
          load_block_8_8(this,iVar4 + -1,0,0);
          code_block(this,0);
          load_block_8_8(this,iVar4,0,0);
          code_block(this,0);
          load_block_8_8(this,iVar4 + -1,1,0);
          code_block(this,0);
          load_block_8_8(this,iVar4,1,0);
          code_block(this,0);
          load_block_16_8(this,iVar3,1);
          code_block(this,1);
          load_block_16_8(this,iVar3,2);
          code_block(this,2);
          iVar3 = iVar3 + 1;
          iVar4 = iVar4 + 2;
        } while (iVar3 < this->m_mcus_per_row);
      }
    }
  }
  return;
}

Assistant:

void jpeg_encoder::process_mcu_row()
	{
		if (m_num_components == 1)
		{
			for (int i = 0; i < m_mcus_per_row; i++)
			{
				load_block_8_8_grey(i); code_block(0);
			}
		}
		else if ((m_comp_h_samp[0] == 1) && (m_comp_v_samp[0] == 1))
		{
			for (int i = 0; i < m_mcus_per_row; i++)
			{
				load_block_8_8(i, 0, 0); code_block(0); load_block_8_8(i, 0, 1); code_block(1); load_block_8_8(i, 0, 2); code_block(2);
			}
		}
		else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 1))
		{
			for (int i = 0; i < m_mcus_per_row; i++)
			{
				load_block_8_8(i * 2 + 0, 0, 0); code_block(0); load_block_8_8(i * 2 + 1, 0, 0); code_block(0);
				load_block_16_8_8(i, 1); code_block(1); load_block_16_8_8(i, 2); code_block(2);
			}
		}
		else if ((m_comp_h_samp[0] == 2) && (m_comp_v_samp[0] == 2))
		{
			for (int i = 0; i < m_mcus_per_row; i++)
			{
				load_block_8_8(i * 2 + 0, 0, 0); code_block(0); load_block_8_8(i * 2 + 1, 0, 0); code_block(0);
				load_block_8_8(i * 2 + 0, 1, 0); code_block(0); load_block_8_8(i * 2 + 1, 1, 0); code_block(0);
				load_block_16_8(i, 1); code_block(1); load_block_16_8(i, 2); code_block(2);
			}
		}
	}